

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_print.c
# Opt level: O3

void easm_print_mods(FILE *out,envy_colors *cols,easm_mods *mods,int spcafter)

{
  char **ppcVar1;
  long lVar2;
  
  if (0 < mods->modsnum) {
    lVar2 = 0;
    do {
      if (spcafter == 0) {
        fputc(0x20,(FILE *)out);
        ppcVar1 = &cols->err;
        if (mods->mods[lVar2]->isunk == 0) {
          ppcVar1 = &cols->mod;
        }
        fprintf((FILE *)out,"%s%s%s",*ppcVar1,mods->mods[lVar2]->str,cols->reset);
      }
      else {
        ppcVar1 = &cols->err;
        if (mods->mods[lVar2]->isunk == 0) {
          ppcVar1 = &cols->mod;
        }
        fprintf((FILE *)out,"%s%s%s",*ppcVar1,mods->mods[lVar2]->str,cols->reset);
        fputc(0x20,(FILE *)out);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < mods->modsnum);
  }
  return;
}

Assistant:

void easm_print_mods(FILE *out, const struct envy_colors *cols, struct easm_mods *mods, int spcafter) {
	int i;
	for (i = 0; i < mods->modsnum; i++) {
		if (!spcafter)
			fprintf(out, " ");
		easm_print_mod(out, cols, mods->mods[i]);
		if (spcafter)
			fprintf(out, " ");
	}
}